

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O0

int Gli_ManCreateCi(Gli_Man_t *p,int nFanouts)

{
  Gli_Obj_t *pGVar1;
  Gli_Obj_t *pObj;
  int nFanouts_local;
  Gli_Man_t *p_local;
  
  pGVar1 = Gli_ObjAlloc(p,0,nFanouts);
  *(uint *)pGVar1 = *(uint *)pGVar1 & 0xfffffffe | 1;
  Vec_IntPush(p->vCis,pGVar1->Handle);
  return pGVar1->Handle;
}

Assistant:

int Gli_ManCreateCi( Gli_Man_t * p, int nFanouts )
{
    Gli_Obj_t * pObj;
    pObj = Gli_ObjAlloc( p, 0, nFanouts );
    pObj->fTerm = 1;
    Vec_IntPush( p->vCis, pObj->Handle );
    return pObj->Handle;
}